

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O1

SRes SzReadAndDecodePackedStreams
               (ILookInStream *inStream,CSzData *sd,CBuf *tempBufs,UInt32 numFoldersMax,
               UInt64 baseOffset,CSzAr *p,ISzAlloc *allocTemp)

{
  ILookInStream *stream;
  SRes SVar1;
  int iVar2;
  SRes SVar3;
  ulong uVar4;
  CBuf *pCVar5;
  UInt64 offset;
  size_t *psVar6;
  bool bVar7;
  UInt64 dataStartPos;
  ILookInStream *local_70;
  CSubStreamInfo ssi;
  
  SVar1 = SzReadStreamsInfo(p,sd,numFoldersMax,(CBuf *)0x0,0,&dataStartPos,&ssi,allocTemp);
  if (SVar1 == 0) {
    offset = baseOffset + dataStartPos;
    if (p->NumFolders == 0) {
      SVar1 = 0x10;
    }
    else {
      dataStartPos = offset;
      local_70 = inStream;
      if (p->NumFolders != 0) {
        uVar4 = 0;
        pCVar5 = tempBufs;
        do {
          Buf_Init(pCVar5);
          uVar4 = uVar4 + 1;
          pCVar5 = pCVar5 + 1;
        } while (uVar4 < p->NumFolders);
      }
      if (p->NumFolders != 0) {
        uVar4 = 0;
        pCVar5 = tempBufs;
        do {
          iVar2 = Buf_Create(pCVar5,p->CoderUnpackSizes
                                    [(uint)p->FoToMainUnpackSizeIndex[uVar4] +
                                     p->FoToCoderUnpackSizes[uVar4]],allocTemp);
          if (iVar2 == 0) {
            return 2;
          }
          uVar4 = uVar4 + 1;
          pCVar5 = pCVar5 + 1;
        } while (uVar4 < p->NumFolders);
      }
      stream = local_70;
      if (p->NumFolders != 0) {
        psVar6 = &tempBufs->size;
        uVar4 = 0;
        SVar1 = 0;
        do {
          SVar3 = LookInStream_SeekTo(stream,offset);
          if (SVar3 == 0) {
            SVar3 = SzAr_DecodeFolder(p,(UInt32)uVar4,stream,offset,((CBuf *)(psVar6 + -1))->data,
                                      *psVar6,allocTemp);
            bVar7 = SVar3 == 0;
            if (!bVar7) {
              SVar1 = SVar3;
            }
          }
          else {
            bVar7 = false;
            SVar1 = SVar3;
          }
          if (!bVar7) {
            return SVar1;
          }
          uVar4 = uVar4 + 1;
          psVar6 = psVar6 + 2;
        } while (uVar4 < p->NumFolders);
      }
      SVar1 = 0;
    }
  }
  return SVar1;
}

Assistant:

static SRes SzReadAndDecodePackedStreams(
    ILookInStream *inStream,
    CSzData *sd,
    CBuf *tempBufs,
    UInt32 numFoldersMax,
    UInt64 baseOffset,
    CSzAr *p,
    ISzAlloc *allocTemp)
{
  UInt64 dataStartPos;
  UInt32 fo;
  CSubStreamInfo ssi;

  RINOK(SzReadStreamsInfo(p, sd, numFoldersMax, NULL, 0, &dataStartPos, &ssi, allocTemp));
  
  dataStartPos += baseOffset;
  if (p->NumFolders == 0)
    return SZ_ERROR_ARCHIVE;
 
  for (fo = 0; fo < p->NumFolders; fo++)
    Buf_Init(tempBufs + fo);
  
  for (fo = 0; fo < p->NumFolders; fo++)
  {
    CBuf *tempBuf = tempBufs + fo;
    UInt64 unpackSize = SzAr_GetFolderUnpackSize(p, fo);
    if ((size_t)unpackSize != unpackSize)
      return SZ_ERROR_MEM;
    if (!Buf_Create(tempBuf, (size_t)unpackSize, allocTemp))
      return SZ_ERROR_MEM;
  }
  
  for (fo = 0; fo < p->NumFolders; fo++)
  {
    const CBuf *tempBuf = tempBufs + fo;
    RINOK(LookInStream_SeekTo(inStream, dataStartPos));
    RINOK(SzAr_DecodeFolder(p, fo, inStream, dataStartPos, tempBuf->data, tempBuf->size, allocTemp));
  }
  
  return SZ_OK;
}